

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

void __thiscall SQASTWritingVisitor::writeNodeHeader(SQASTWritingVisitor *this,Node *n)

{
  OutputStream::writeInt32(this->stream,n->_op + TO_IF);
  OutputStream::writeInt32(this->stream,(n->_coordinates).lineStart);
  OutputStream::writeInt32(this->stream,(n->_coordinates).columnStart);
  OutputStream::writeInt32(this->stream,(n->_coordinates).lineEnd);
  OutputStream::writeInt32(this->stream,(n->_coordinates).columnEnd);
  return;
}

Assistant:

void SQASTWritingVisitor::writeNodeHeader(const Node *n) {
  stream->writeInt32(n->op() + OP_DELTA);

  stream->writeInt32(n->lineStart());
  stream->writeInt32(n->columnStart());
  stream->writeInt32(n->lineEnd());
  stream->writeInt32(n->columnEnd());
}